

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::AuthenticatedStream,_kj::WaiterQueue<kj::AuthenticatedStream>::Node>::
reject(AdapterPromiseNode<kj::AuthenticatedStream,_kj::WaiterQueue<kj::AuthenticatedStream>::Node>
       *this,Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<kj::AuthenticatedStream> local_1d8;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<kj::AuthenticatedStream,_kj::WaiterQueue<kj::AuthenticatedStream>::Node>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<kj::AuthenticatedStream>::ExceptionOr(&local_1d8,false,exception_00);
    ExceptionOr<kj::AuthenticatedStream>::operator=(&this->result,&local_1d8);
    ExceptionOr<kj::AuthenticatedStream>::~ExceptionOr(&local_1d8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }